

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O2

int fy_node_insert(fy_node *fyn_to,fy_node *fyn_from)

{
  undefined1 *puVar1;
  fy_document *fyd;
  long lVar2;
  byte bVar3;
  _Bool _Var4;
  int iVar5;
  fy_node *pfVar6;
  fy_token *pfVar7;
  fy_node_pair *pfVar8;
  fy_node_pair *pfVar9;
  fy_node *pfVar10;
  int line;
  list_head *plVar11;
  list_head *plVar12;
  fy_token *pfVar13;
  char *pcVar14;
  anon_union_16_3_aa7ec5a3_for_fy_node_12 *paVar15;
  fy_token *pfVar16;
  
  iVar5 = -1;
  if (fyn_to == (fy_node *)0x0) {
    return -1;
  }
  fyd = fyn_to->fyd;
  if (fyd == (fy_document *)0x0) {
    return -1;
  }
  pfVar10 = fyn_to->parent;
  if (pfVar10 == (fy_node *)0x0) {
    if (fyd->root != fyn_to) {
      __assert_fail("fyn_parent || fyn_to == fyd->root",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                    ,0x809,"int fy_node_insert(struct fy_node *, struct fy_node *)");
    }
    plVar11 = (list_head *)0x0;
    if (fyn_from == (fy_node *)0x0) {
      fyn_to->parent = (fy_node *)0x0;
      fy_document_diag(fyd,0x40,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0x810,"fy_node_insert","Deleting root node");
      fy_node_detach_and_free(fyn_to);
      fyd->root = (fy_node *)0x0;
      return 0;
    }
  }
  else {
    bVar3 = pfVar10->field_0x34 & 3;
    if (bVar3 == 0) {
      pcVar14 = "Illegal scalar parent node type";
      line = 0x7f9;
      goto LAB_0011e80b;
    }
    if (fyn_from == (fy_node *)0x0) {
      pcVar14 = "Illegal NULL source node";
      line = 0x7fc;
      goto LAB_0011e80b;
    }
    if (bVar3 == 2) {
      plVar12 = (list_head *)&pfVar10->field_12;
      do {
        plVar12 = ((list_head *)&plVar12->next)->next;
        if (plVar12 == (list_head *)&pfVar10->field_12) {
          plVar12 = (list_head *)0x0;
        }
        plVar11 = (list_head *)0x0;
      } while ((plVar12 != (list_head *)0x0) &&
              (plVar11 = plVar12, (fy_node *)plVar12[1].prev != fyn_to));
    }
    else {
      plVar11 = (list_head *)0x0;
    }
  }
  bVar3 = fyn_from->field_0x34 & 3;
  if ((bVar3 == 0) || (bVar3 != (fyn_to->field_0x34 & 3))) {
    pfVar6 = fy_node_copy(fyd,fyn_from);
    if (pfVar6 == (fy_node *)0x0) {
      pcVar14 = "fy_node_copy() failed";
      line = 0x845;
    }
    else {
      if (pfVar10 == (fy_node *)0x0) {
        fy_document_diag(fyd,0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0x848,"fy_node_insert","Replacing root node");
        fy_node_detach_and_free(fyd->root);
        fyd->root = pfVar6;
        return 0;
      }
      if ((pfVar10->field_0x34 & 3) == 1) {
        fy_document_diag(fyd,0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0x84c,"fy_node_insert","Replacing sequence node");
        paVar15 = &pfVar10->field_12;
        plVar11 = (fyn_to->node).next;
        plVar12 = (fyn_to->node).prev;
        plVar11->prev = plVar12;
        plVar12->next = plVar11;
        (fyn_to->node).next = &fyn_to->node;
        (fyn_to->node).prev = &fyn_to->node;
        fy_node_detach_and_free(fyn_to);
        if (plVar12 != (list_head *)paVar15) {
          plVar11 = plVar12->next;
          plVar11->prev = &pfVar6->node;
          (pfVar6->node).next = plVar11;
          (pfVar6->node).prev = plVar12;
          plVar12->next = &pfVar6->node;
          return 0;
        }
        plVar11 = (paVar15->sequence)._lh.next;
        plVar11->prev = &pfVar6->node;
        (pfVar6->node).next = plVar11;
        (pfVar6->node).prev = (list_head *)paVar15;
        (paVar15->sequence)._lh.next = &pfVar6->node;
        return 0;
      }
      fy_document_diag(fyd,0x40,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0x85b,"fy_node_insert","Replacing mapping node value");
      if ((pfVar10->field_0x34 & 3) != 2) {
        __assert_fail("fyn_parent->type == FYNT_MAPPING",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                      ,0x85d,"int fy_node_insert(struct fy_node *, struct fy_node *)");
      }
      if (plVar11 != (list_head *)0x0) {
        fy_node_detach_and_free((fy_node *)plVar11[1].prev);
        plVar11[1].prev = &pfVar6->node;
        return 0;
      }
      pcVar14 = "Illegal mapping node found";
      line = 0x85f;
    }
LAB_0011e80b:
    fy_document_diag(fyd,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                     ,line,"fy_node_insert",pcVar14);
    return iVar5;
  }
  paVar15 = &fyn_to->field_12;
  if (bVar3 != 1) {
    pfVar7 = (fyn_from->field_12).scalar;
    do {
      pfVar16 = (fy_token *)0x0;
      if (pfVar7 != (fy_token *)&fyn_from->field_12) {
        pfVar16 = pfVar7;
      }
      if (pfVar16 == (fy_token *)0x0) goto LAB_0011e5b2;
      if (fyn_to->xl == (fy_accel *)0x0) {
        pfVar9 = (fy_node_pair *)(paVar15->sequence)._lh.next;
        while( true ) {
          pfVar8 = (fy_node_pair *)0x0;
          if (pfVar9 != (fy_node_pair *)paVar15) {
            pfVar8 = pfVar9;
          }
          if (pfVar8 == (fy_node_pair *)0x0) goto LAB_0011e4e2;
          _Var4 = fy_node_compare(*(fy_node **)&pfVar16->type,pfVar8->key);
          if (_Var4) break;
          pfVar9 = (fy_node_pair *)(pfVar8->node).next;
        }
LAB_0011e472:
        fy_document_diag(fyd,0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0x8a3,"fy_node_insert","Updating mapping node value (deep merge)");
        iVar5 = fy_node_insert(pfVar8->value,*(fy_node **)&pfVar16->analyze_flags);
        if (iVar5 != 0) {
          fy_document_diag(fyd,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                           ,0x8a7,"fy_node_insert","fy_node_insert() failed");
          return iVar5;
        }
      }
      else {
        pfVar8 = fy_node_accel_lookup_by_node(fyn_to,*(fy_node **)&pfVar16->type);
        if (pfVar8 != (fy_node_pair *)0x0) goto LAB_0011e472;
LAB_0011e4e2:
        fy_document_diag(fyd,0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0x88b,"fy_node_insert","Appending to mapping node");
        pfVar9 = fy_node_pair_alloc(fyd);
        if (pfVar9 == (fy_node_pair *)0x0) {
          pcVar14 = "fy_node_pair_alloc() failed";
          iVar5 = 0x890;
          goto LAB_0011e869;
        }
        pfVar10 = fy_node_copy(fyd,*(fy_node **)&pfVar16->type);
        pfVar9->key = pfVar10;
        if ((pfVar10 == (fy_node *)0x0) &&
           (lVar2._0_4_ = pfVar16->type, lVar2._4_4_ = pfVar16->refs, lVar2 != 0)) {
          pcVar14 = "fy_node_copy() failed";
          iVar5 = 0x894;
          goto LAB_0011e869;
        }
        pfVar10 = fy_node_copy(fyd,*(fy_node **)&pfVar16->analyze_flags);
        pfVar9->value = pfVar10;
        if ((pfVar10 == (fy_node *)0x0) && (*(long *)&pfVar16->analyze_flags != 0)) {
          pcVar14 = "fy_node_copy() failed";
          iVar5 = 0x897;
          goto LAB_0011e869;
        }
        plVar11 = (fyn_to->field_12).sequence._lh.prev;
        (fyn_to->field_12).sequence._lh.prev = &pfVar9->node;
        (pfVar9->node).next = (list_head *)paVar15;
        (pfVar9->node).prev = plVar11;
        plVar11->next = &pfVar9->node;
        if (fyn_to->xl != (fy_accel *)0x0) {
          fy_accel_insert(fyn_to->xl,pfVar9->key,pfVar9);
        }
        if (pfVar9->key != (fy_node *)0x0) {
          puVar1 = &pfVar9->key->field_0x34;
          *puVar1 = *puVar1 | 8;
        }
        if (pfVar9->value != (fy_node *)0x0) {
          puVar1 = &pfVar9->value->field_0x34;
          *puVar1 = *puVar1 | 8;
        }
      }
      pfVar7 = (fy_token *)(pfVar16->node).next;
    } while( true );
  }
  fy_document_diag(fyd,0x40,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                   ,0x86b,"fy_node_insert","Appending to sequence node");
  pfVar10 = (fy_node *)&fyn_from->field_12;
  while( true ) {
    pfVar6 = (fy_node *)(pfVar10->node).next;
    pfVar10 = (fy_node *)0x0;
    if (pfVar6 != (fy_node *)&fyn_from->field_12) {
      pfVar10 = pfVar6;
    }
    if (pfVar10 == (fy_node *)0x0) goto LAB_0011e5b2;
    pfVar6 = fy_node_copy(fyd,pfVar10);
    if (pfVar6 == (fy_node *)0x0) break;
    plVar11 = (fyn_to->field_12).sequence._lh.prev;
    (fyn_to->field_12).sequence._lh.prev = &pfVar6->node;
    (pfVar6->node).next = (list_head *)paVar15;
    (pfVar6->node).prev = plVar11;
    plVar11->next = &pfVar6->node;
    pfVar6->field_0x34 = pfVar6->field_0x34 | 8;
  }
  pcVar14 = "fy_node_copy() failed";
  iVar5 = 0x872;
LAB_0011e869:
  fy_document_diag(fyd,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                   ,iVar5,"fy_node_insert",pcVar14);
  return -1;
LAB_0011e5b2:
  bVar3 = fyn_to->field_0x34 & 3;
  if (bVar3 == 2) {
    pfVar7 = (fy_token *)0x0;
    if ((fyn_to->field_12).scalar != (fy_token *)&fyn_to->field_12) {
      pfVar7 = (fyn_to->field_12).scalar;
    }
    while (pfVar7 != (fy_token *)0x0) {
      pfVar16 = (fy_token *)(pfVar7->node).next;
      pfVar13 = (fy_token *)0x0;
      if (pfVar16 != (fy_token *)&fyn_to->field_12) {
        pfVar13 = pfVar16;
      }
      if (*(long *)&pfVar7->type != 0) {
        *(undefined8 *)(*(long *)&pfVar7->type + 0x20) = 0;
      }
      if (*(long *)&pfVar7->analyze_flags != 0) {
        *(fy_node **)(*(long *)&pfVar7->analyze_flags + 0x20) = fyn_to;
      }
      pfVar7->text = (char *)fyn_to;
      pfVar7 = pfVar13;
    }
  }
  else if (bVar3 == 1) {
    plVar11 = (list_head *)paVar15;
    while( true ) {
      plVar11 = ((list_head *)&plVar11->next)->next;
      if (plVar11 == (list_head *)paVar15) {
        plVar11 = (list_head *)0x0;
      }
      if (plVar11 == (list_head *)0x0) break;
      plVar11[2].next = &fyn_to->node;
    }
  }
  if (fyn_to->fyd == fyn_from->fyd) {
    return 0;
  }
  iVar5 = fy_document_state_merge(fyn_to->fyd->fyds,fyn_from->fyd->fyds);
  if (iVar5 != 0) {
    pcVar14 = "fy_document_state_merge() failed";
    line = 0x8cb;
    goto LAB_0011e80b;
  }
  iVar5 = fy_document_node_update_tags(fyd,fyd->root);
  if (iVar5 == 0) {
    return 0;
  }
  pcVar14 = "fy_document_node_update_tags() failed";
  iVar5 = 0x8cf;
  goto LAB_0011e869;
}

Assistant:

int fy_node_insert(struct fy_node *fyn_to, struct fy_node *fyn_from) {
    struct fy_document *fyd;
    struct fy_node *fyn_parent, *fyn_cpy, *fyni, *fyn_prev;
    struct fy_node_pair *fynp, *fynpi, *fynpj;
    int rc;

    if (!fyn_to || !fyn_to->fyd)
        return -1;

    fyd = fyn_to->fyd;
    assert(fyd);

    fyn_parent = fyn_to->parent;
    fynp = NULL;
    if (fyn_parent) {
        fyd_error_check(fyd, fyn_parent->type != FYNT_SCALAR, err_out,
                        "Illegal scalar parent node type");

        fyd_error_check(fyd, fyn_from, err_out,
                        "Illegal NULL source node");

        if (fyn_parent->type == FYNT_MAPPING) {
            /* find mapping pair that contains the `to` node */
            for (fynp = fy_node_pair_list_head(&fyn_parent->mapping); fynp;
                 fynp = fy_node_pair_next(&fyn_parent->mapping, fynp)) {
                if (fynp->value == fyn_to)
                    break;
            }
        }
    }

    /* verify no funkiness on root */
    assert(fyn_parent || fyn_to == fyd->root);

    /* deleting target */
    if (!fyn_from) {
        fyn_to->parent = NULL;

        if (!fyn_parent) {
            fyd_doc_debug(fyd, "Deleting root node");
            fy_node_detach_and_free(fyn_to);
            fyd->root = NULL;
        } else if (fyn_parent->type == FYNT_SEQUENCE) {
            fyd_doc_debug(fyd, "Deleting sequence node");
            fy_node_list_del(&fyn_parent->sequence, fyn_to);
            fy_node_detach_and_free(fyn_to);
        } else {
            fyd_doc_debug(fyd, "Deleting mapping node");
            /* should never happen, it's checked right above, but play safe */
            assert(fyn_parent->type == FYNT_MAPPING);

            fyd_error_check(fyd, fynp, err_out,
                            "Illegal mapping node found");

            fy_node_pair_list_del(&fyn_parent->mapping, fynp);
            if (fyn_parent->xl)
                fy_accel_remove(fyn_parent->xl, fynp->key);
            /* this will also delete fyn_to */
            fy_node_pair_detach_and_free(fynp);
        }
        return 0;
    }

    /*
	 * from: scalar
	 *
	 * to: another-scalar -> scalar
	 * to: { key: value } -> scalar
	 * to: [ seq0, seq1 ] -> scalar
	 *
	 * from: [ seq2 ]
	 * to: scalar -> [ seq2 ]
	 * to: { key: value } -> [ seq2 ]
	 * to: [ seq0, seq1 ] -> [ seq0, seq1, sec2 ]
	 *
	 * from: { another-key: another-value }
	 * to: scalar -> { another-key: another-value }
	 * to: { key: value } -> { key: value, another-key: another-value }
	 * to: [ seq0, seq1 ] -> { another-key: another-value }
	 *
	 * from: { key: another-value }
	 * to: scalar -> { key: another-value }
	 * to: { key: value } -> { key: another-value }
	 * to: [ seq0, seq1 ] -> { key: another-value }
	 *
	 */

    /* if types of `from` and `to` differ (or it's a scalar), it's a replace */
    if (fyn_from->type != fyn_to->type || fyn_from->type == FYNT_SCALAR) {

        fyn_cpy = fy_node_copy(fyd, fyn_from);
        fyd_error_check(fyd, fyn_cpy, err_out,
                        "fy_node_copy() failed");

        if (!fyn_parent) {
            fyd_doc_debug(fyd, "Replacing root node");
            fy_node_detach_and_free(fyd->root);
            fyd->root = fyn_cpy;
        } else if (fyn_parent->type == FYNT_SEQUENCE) {
            fyd_doc_debug(fyd, "Replacing sequence node");

            /* get previous */
            fyn_prev = fy_node_prev(&fyn_parent->sequence, fyn_to);

            /* delete */
            fy_node_list_del(&fyn_parent->sequence, fyn_to);
            fy_node_detach_and_free(fyn_to);

            /* if there's no previous insert to head */
            if (!fyn_prev)
                fy_node_list_add(&fyn_parent->sequence, fyn_cpy);
            else
                fy_node_list_insert_after(&fyn_parent->sequence, fyn_prev, fyn_cpy);
        } else {
            fyd_doc_debug(fyd, "Replacing mapping node value");
            /* should never happen, it's checked right above, but play safe */
            assert(fyn_parent->type == FYNT_MAPPING);
            fyd_error_check(fyd, fynp, err_out,
                            "Illegal mapping node found");

            fy_node_detach_and_free(fynp->value);
            fynp->value = fyn_cpy;
        }

        return 0;
    }

    /* types match, if it's a sequence append */
    if (fyn_to->type == FYNT_SEQUENCE) {

        fyd_doc_debug(fyd, "Appending to sequence node");

        for (fyni = fy_node_list_head(&fyn_from->sequence); fyni;
             fyni = fy_node_next(&fyn_from->sequence, fyni)) {

            fyn_cpy = fy_node_copy(fyd, fyni);
            fyd_error_check(fyd, fyn_cpy, err_out,
                            "fy_node_copy() failed");

            fy_node_list_add_tail(&fyn_to->sequence, fyn_cpy);
            fyn_cpy->attached = true;
        }
    } else {
        /* only mapping is possible here */

        /* iterate over all the keys in the `from` */
        for (fynpi = fy_node_pair_list_head(&fyn_from->mapping); fynpi;
             fynpi = fy_node_pair_next(&fyn_from->mapping, fynpi)) {

            if (fyn_to->xl) {
                fynpj = fy_node_accel_lookup_by_node(fyn_to, fynpi->key);
            } else {
                /* find whether the key already exists */
                for (fynpj = fy_node_pair_list_head(&fyn_to->mapping); fynpj;
                     fynpj = fy_node_pair_next(&fyn_to->mapping, fynpj)) {

                    if (fy_node_compare(fynpi->key, fynpj->key))
                        break;
                }
            }

            if (!fynpj) {
                fyd_doc_debug(fyd, "Appending to mapping node");

                /* not found? append it */
                fynpj = fy_node_pair_alloc(fyd);
                fyd_error_check(fyd, fynpj, err_out,
                                "fy_node_pair_alloc() failed");

                fynpj->key = fy_node_copy(fyd, fynpi->key);
                fyd_error_check(fyd, !fynpi->key || fynpj->key, err_out,
                                "fy_node_copy() failed");
                fynpj->value = fy_node_copy(fyd, fynpi->value);
                fyd_error_check(fyd, !fynpi->value || fynpj->value, err_out,
                                "fy_node_copy() failed");

                fy_node_pair_list_add_tail(&fyn_to->mapping, fynpj);
                if (fyn_to->xl)
                    fy_accel_insert(fyn_to->xl, fynpj->key, fynpj);

                if (fynpj->key)
                    fynpj->key->attached = true;
                if (fynpj->value)
                    fynpj->value->attached = true;

            } else {
                fyd_doc_debug(fyd, "Updating mapping node value (deep merge)");

                rc = fy_node_insert(fynpj->value, fynpi->value);
                fyd_error_check(fyd, !rc, err_out_rc,
                                "fy_node_insert() failed");
            }
        }
    }

    /* adjust parents */
    switch (fyn_to->type) {
        case FYNT_SCALAR:
            break;

        case FYNT_SEQUENCE:
            for (fyni = fy_node_list_head(&fyn_to->sequence); fyni;
                 fyni = fy_node_next(&fyn_to->sequence, fyni)) {

                fyni->parent = fyn_to;
            }
            break;

        case FYNT_MAPPING:
            for (fynp = fy_node_pair_list_head(&fyn_to->mapping); fynp; fynp = fynpi) {

                fynpi = fy_node_pair_next(&fyn_to->mapping, fynp);

                if (fynp->key)
                    fynp->key->parent = NULL;
                if (fynp->value)
                    fynp->value->parent = fyn_to;
                fynp->parent = fyn_to;
            }
            break;
    }

    /* if the documents differ, merge their states */
    if (fyn_to->fyd != fyn_from->fyd) {
        rc = fy_document_state_merge(fyn_to->fyd->fyds, fyn_from->fyd->fyds);
        fyd_error_check(fyd, !rc, err_out_rc,
                        "fy_document_state_merge() failed");

        rc = fy_document_node_update_tags(fyd, fy_document_root(fyd));
        fyd_error_check(fyd, !rc, err_out_rc,
                        "fy_document_node_update_tags() failed");
    }

    return 0;

    err_out:
    rc = -1;
    err_out_rc:
    return rc;
}